

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSynchStateController::DecrementSignalCount
          (CSynchStateController *this,LONG lAmountToDecrement)

{
  LONG LVar1;
  CPalThread *pCVar2;
  LONG lCount;
  PAL_ERROR palErr;
  LONG lAmountToDecrement_local;
  CSynchStateController *this_local;
  
  pCVar2 = InternalGetCurrentThread();
  if (pCVar2 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","DecrementSignalCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x261);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  if (lAmountToDecrement < 1) {
    fprintf(_stderr,"] %s %s:%d","DecrementSignalCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x262);
    fprintf(_stderr,"Expression: lAmountToDecrement > 0\n");
  }
  LVar1 = CSynchData::GetSignalCount((this->super_CSynchControllerBase).m_psdSynchData);
  if (LVar1 < lAmountToDecrement) {
    fprintf(_stderr,"] %s %s:%d","DecrementSignalCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x266);
    fprintf(_stderr,"Expression: lAmountToDecrement <= lCount\n");
  }
  CSynchData::SetSignalCount
            ((this->super_CSynchControllerBase).m_psdSynchData,LVar1 - lAmountToDecrement);
  return 0;
}

Assistant:

PAL_ERROR CSynchStateController::DecrementSignalCount(
        LONG lAmountToDecrement)
    {
        VALIDATEOBJECT(m_psdSynchData);

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        _ASSERTE(lAmountToDecrement > 0);
        
        PAL_ERROR palErr = NO_ERROR;
        LONG lCount = m_psdSynchData->GetSignalCount();
        _ASSERTE(lAmountToDecrement <= lCount);

        m_psdSynchData->SetSignalCount(lCount - lAmountToDecrement);
        
        return palErr;
    }